

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1482a::TestCheckEqualsWithStringsWorksOnContentsWithALiteral::RunImpl
          (TestCheckEqualsWithStringsWorksOnContentsWithALiteral *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestResults results;
  int local_50 [2];
  TestDetails local_48;
  TestResults local_28;
  
  UnitTest::TestResults::TestResults(&local_28,(TestReporter *)0x0);
  UnitTest::TestDetails::TestDetails(&local_48,"","","",0);
  UnitTest::CheckEqual(&local_28,"Hello",(anonymous_namespace)::txt1,&local_48);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_50[1] = 0;
  local_50[0] = UnitTest::TestResults::GetFailureCount(&local_28);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_48,*ppTVar2,0x46);
  UnitTest::CheckEqual<int,int>(results_00,local_50 + 1,local_50,&local_48);
  return;
}

Assistant:

TEST(CheckEqualsWithStringsWorksOnContentsWithALiteral)
{
    char const* const p1 = txt1;
    TestResults results;
    CheckEqual(results, "Hello", p1, TestDetails("", "", "", 0));
    CHECK_EQUAL(0, results.GetFailureCount());
}